

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.cpp
# Opt level: O0

void so_5::agent_t::demand_handler_on_message
               (current_thread_id_t working_thread_id,execution_demand_t *d)

{
  event_handler_data_t *d_00;
  function<void_(so_5::invocation_type_t,_so_5::intrusive_ptr_t<so_5::message_t>_&)> local_48;
  current_thread_id_t local_28;
  function<void_(so_5::invocation_type_t,_so_5::intrusive_ptr_t<so_5::message_t>_&)> *local_20;
  event_handler_data_t *handler;
  execution_demand_t *d_local;
  current_thread_id_t working_thread_id_local;
  
  handler = (event_handler_data_t *)d;
  d_local = (execution_demand_t *)working_thread_id._M_thread;
  message_limit::control_block_t::decrement(d->m_limit);
  local_20 = (function<void_(so_5::invocation_type_t,_so_5::intrusive_ptr_t<so_5::message_t>_&)> *)
             (**(code **)(*(long *)&(handler->m_method).super__Function_base._M_functor + 200))
                       (handler,"demand_handler_on_message");
  d_00 = handler;
  if (local_20 !=
      (function<void_(so_5::invocation_type_t,_so_5::intrusive_ptr_t<so_5::message_t>_&)> *)0x0) {
    local_28._M_thread = (native_handle_type)d_local;
    std::function<void_(so_5::invocation_type_t,_so_5::intrusive_ptr_t<so_5::message_t>_&)>::
    function(&local_48,local_20);
    process_message(local_28,(execution_demand_t *)d_00,&local_48);
    std::function<void_(so_5::invocation_type_t,_so_5::intrusive_ptr_t<so_5::message_t>_&)>::
    ~function(&local_48);
  }
  return;
}

Assistant:

void
agent_t::demand_handler_on_message(
	current_thread_id_t working_thread_id,
	execution_demand_t & d )
{
	message_limit::control_block_t::decrement( d.m_limit );

	auto handler = d.m_receiver->m_handler_finder(
			d, "demand_handler_on_message" );
	if( handler )
		process_message( working_thread_id, d, handler->m_method );
}